

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall DL::Lexer::next(Token *__return_storage_ptr__,Lexer *this)

{
  TokenType TVar1;
  pointer pcVar2;
  Token *token;
  
  TVar1 = (this->mNextToken).Type;
  if (TVar1 == T_EOF) {
    getNextToken(__return_storage_ptr__,this);
  }
  else {
    __return_storage_ptr__->Type = TVar1;
    (__return_storage_ptr__->Value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->Value).field_2;
    pcVar2 = (this->mNextToken).Value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->Value,pcVar2,
               pcVar2 + (this->mNextToken).Value._M_string_length);
    this->mLineNumber = this->mNextLineNumber;
    this->mColumnNumber = this->mNextColumnNumber;
    (this->mNextToken).Type = T_EOF;
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::next()
{
	// Restore from look()
	if (mNextToken.Type != T_EOF) {
		Token token		= mNextToken;
		mColumnNumber   = mNextColumnNumber;
		mLineNumber		= mNextLineNumber;
		mNextToken.Type = T_EOF;
		return token;
	} else {
		return getNextToken();
	}
}